

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_Pointer.cpp
# Opt level: O3

ostream * psy::C::operator<<(ostream *os,PointerType *ptrTy)

{
  long lVar1;
  char *pcVar2;
  
  if (ptrTy == (PointerType *)0x0) {
    pcVar2 = "<PointerType is null>";
    lVar1 = 0x15;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"<PointerType | ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(os," referenced-type:",0x11);
    operator<<(os,*(Type **)((ptrTy->super_Type).impl_._M_t.
                             super___uniq_ptr_impl<psy::C::Type::TypeImpl,_std::default_delete<psy::C::Type::TypeImpl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_psy::C::Type::TypeImpl_*,_std::default_delete<psy::C::Type::TypeImpl>_>
                             .super__Head_base<0UL,_psy::C::Type::TypeImpl_*,_false>._M_head_impl +
                            2));
    pcVar2 = ">";
    lVar1 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return os;
}

Assistant:

PSY_C_API std::ostream& operator<<(std::ostream& os, const PointerType* ptrTy)
{
    if (!ptrTy)
        return os << "<PointerType is null>";
    os << "<PointerType | ";
    os << " referenced-type:" << ptrTy->referencedType();
    os << ">";
    return os;
}